

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemas.c
# Opt level: O0

void cdataBlockSplit(void *ctx,xmlChar *value,int len)

{
  xmlSchemaSAXPlugPtr ctxt;
  int len_local;
  xmlChar *value_local;
  void *ctx_local;
  
  if (ctx != (void *)0x0) {
    if ((*(long *)((long)ctx + 0x10) != 0) && (*(long *)(*(long *)((long)ctx + 0x10) + 200) != 0)) {
      (**(code **)(*(long *)((long)ctx + 0x10) + 200))(*(undefined8 *)((long)ctx + 0x20),value,len);
    }
    if (*(long *)((long)ctx + 0x128) != 0) {
      xmlSchemaSAXHandleCDataSection(*(void **)((long)ctx + 0x128),value,len);
    }
  }
  return;
}

Assistant:

static void
cdataBlockSplit(void *ctx, const xmlChar *value, int len)
{
    xmlSchemaSAXPlugPtr ctxt = (xmlSchemaSAXPlugPtr) ctx;
    if (ctxt == NULL)
        return;
    if ((ctxt->user_sax != NULL) &&
        (ctxt->user_sax->cdataBlock != NULL))
	ctxt->user_sax->cdataBlock(ctxt->user_data, value, len);
    if (ctxt->ctxt != NULL)
	xmlSchemaSAXHandleCDataSection(ctxt->ctxt, value, len);
}